

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pointer_based_iterator.cpp
# Opt level: O2

void __thiscall
PointerBasedIterator_PreDecrement_Test::~PointerBasedIterator_PreDecrement_Test
          (PointerBasedIterator_PreDecrement_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F (PointerBasedIterator, PreDecrement) {
    std::array<int, 3> arr{{1, 3, 5}};
    iterator i{&arr[0] + 3};
    EXPECT_EQ (--i, iterator{&arr[2]});
    EXPECT_EQ (*i, 5);
    EXPECT_EQ (--i, iterator{&arr[1]});
    EXPECT_EQ (*i, 3);
}